

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O3

bool __thiscall anon_unknown.dwarf_2dcf93::Db::parseSeqId(Db *this,size_t *Out)

{
  byte bVar1;
  bool bVar2;
  size_t sVar3;
  byte *pbVar4;
  long lVar5;
  
  pbVar4 = (byte *)this->First;
  bVar2 = true;
  if ((((byte *)this->Last != pbVar4) && (bVar1 = *pbVar4, '/' < (char)bVar1)) &&
     ((byte)(bVar1 + 0xbf) < 0x1a || bVar1 < 0x3a)) {
    sVar3 = 0;
    do {
      bVar1 = *pbVar4;
      if (((long)(char)bVar1 < 0x30) ||
         ((lVar5 = -0x30, 0x39 < bVar1 && (lVar5 = -0x37, 0x19 < (byte)(bVar1 + 0xbf))))) break;
      sVar3 = lVar5 + sVar3 * 0x24 + (long)(char)bVar1;
      pbVar4 = pbVar4 + 1;
      this->First = (char *)pbVar4;
    } while (pbVar4 != (byte *)this->Last);
    *Out = sVar3;
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool Db::parseSeqId(size_t *Out) {
  if (!(look() >= '0' && look() <= '9') &&
      !(look() >= 'A' && look() <= 'Z'))
    return true;

  size_t Id = 0;
  while (true) {
    if (look() >= '0' && look() <= '9') {
      Id *= 36;
      Id += static_cast<size_t>(look() - '0');
    } else if (look() >= 'A' && look() <= 'Z') {
      Id *= 36;
      Id += static_cast<size_t>(look() - 'A') + 10;
    } else {
      *Out = Id;
      return false;
    }
    ++First;
  }
}